

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O3

AggregateFunction * duckdb::ApproxTopKFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_b1;
  LogicalType local_b0;
  LogicalType local_98;
  vector<duckdb::LogicalType,_true> local_80;
  string local_68;
  LogicalType local_48 [2];
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"approx_top_k","");
  LogicalType::LogicalType(local_48,ANY);
  LogicalType::LogicalType(local_48 + 1,BIGINT);
  __l._M_len = 2;
  __l._M_array = local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_80,__l,
             &local_b1);
  LogicalType::LogicalType(&local_b0,ANY);
  LogicalType::LIST(&local_98,&local_b0);
  AggregateFunction::AggregateFunction
            (in_RDI,&local_68,&local_80,&local_98,
             AggregateFunction::StateSize<duckdb::ApproxTopKState>,
             AggregateFunction::
             StateInitialize<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation,(duckdb::AggregateDestructorType)0>
             ,ApproxTopKUpdate<duckdb::string_t,duckdb::HistogramGenericFunctor>,
             AggregateFunction::StateCombine<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>,
             ApproxTopKFinalize<duckdb::HistogramGenericFunctor>,(aggregate_simple_update_t)0x0,
             ApproxTopKBind,
             AggregateFunction::StateDestroy<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_98);
  LogicalType::~LogicalType(&local_b0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_80);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_48[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

AggregateFunction ApproxTopKFun::GetFunction() {
	using STATE = ApproxTopKState;
	using OP = ApproxTopKOperation;
	return AggregateFunction("approx_top_k", {LogicalTypeId::ANY, LogicalType::BIGINT},
	                         LogicalType::LIST(LogicalType::ANY), AggregateFunction::StateSize<STATE>,
	                         AggregateFunction::StateInitialize<STATE, OP>, ApproxTopKUpdate,
	                         AggregateFunction::StateCombine<STATE, OP>, ApproxTopKFinalize, nullptr, ApproxTopKBind,
	                         AggregateFunction::StateDestroy<STATE, OP>);
}